

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::AddLine(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float thickness)

{
  ImVec2 local_30;
  
  if (0xffffff < col) {
    local_30.x = (*a).x + 0.5;
    local_30.y = (*a).y + 0.5;
    ImVector<ImVec2>::push_back(&this->_Path,&local_30);
    local_30.x = (*b).x + 0.5;
    local_30.y = (*b).y + 0.5;
    ImVector<ImVec2>::push_back(&this->_Path,&local_30);
    PathStroke(this,col,false,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& a, const ImVec2& b, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(a + ImVec2(0.5f,0.5f));
    PathLineTo(b + ImVec2(0.5f,0.5f));
    PathStroke(col, false, thickness);
}